

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

void handle_sqlite_callback
               (void *qobj,int aoperation,char *adbname,char *atablename,sqlite3_int64 arowid)

{
  QString *in_RDX;
  undefined4 in_ESI;
  QMetaMethodArgument *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QSQLiteDriver *driver;
  undefined4 in_stack_ffffffffffffff80;
  QMetaMethodArgument *in_stack_ffffffffffffff90;
  ConnectionType in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  QObject *in_stack_ffffffffffffffa8;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != (QMetaMethodArgument *)0x0) {
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(in_ESI,in_stack_ffffffffffffff80),(char **)in_RDX);
    QVar1.m_data = (storage_type_conflict *)in_stack_ffffffffffffffa8;
    QVar1.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar1);
    QtPrivate::Invoke::argument<QString>((char *)CONCAT44(in_ESI,in_stack_ffffffffffffff80),in_RDX);
    QtPrivate::Invoke::argument<long_long>
              ((char *)CONCAT44(in_ESI,in_stack_ffffffffffffff80),(longlong *)in_RDX);
    QMetaObject::invokeMethod<QMetaMethodArgument,QMetaMethodArgument>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               in_stack_ffffffffffffff90,in_RDI);
    QString::~QString((QString *)0x119de7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void handle_sqlite_callback(void *qobj,int aoperation, char const *adbname, char const *atablename,
                                   sqlite3_int64 arowid)
{
    Q_UNUSED(aoperation);
    Q_UNUSED(adbname);
    QSQLiteDriver *driver = static_cast<QSQLiteDriver *>(qobj);
    if (driver) {
        QMetaObject::invokeMethod(driver, "handleNotification", Qt::QueuedConnection,
                                  Q_ARG(QString, QString::fromUtf8(atablename)), Q_ARG(qint64, arowid));
    }
}